

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_has_unordered_map_Test::~ObjectTest_basic_has_unordered_map_Test
          (ObjectTest_basic_has_unordered_map_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_has_unordered_map) {
	object obj;

	EXPECT_FALSE(obj.has<unordered_map_str_str>());
	EXPECT_FALSE(obj.has<unordered_map_str_strv>());
	EXPECT_FALSE(obj.has<unordered_map_str_obj>());
	EXPECT_FALSE(obj.has<unordered_map_strv_str>());
	EXPECT_FALSE(obj.has<unordered_map_strv_strv>());
	EXPECT_FALSE(obj.has<unordered_map_strv_obj>());
}